

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

void HTS_Model_clear(HTS_Model *model)

{
  _HTS_Tree *p_Var1;
  HTS_Model *in_RDI;
  HTS_Tree *next_tree;
  HTS_Tree *tree;
  HTS_Question *next_question;
  HTS_Question *question;
  size_t j;
  size_t i;
  HTS_Question *in_stack_ffffffffffffffd0;
  HTS_Tree *tree_00;
  HTS_Question *local_20;
  ulong local_18;
  ulong local_10;
  
  local_20 = in_RDI->question;
  while (local_20 != (HTS_Question *)0x0) {
    local_20 = local_20->next;
    HTS_Question_clear(in_stack_ffffffffffffffd0);
    HTS_free((void *)0x2124b1);
  }
  tree_00 = in_RDI->tree;
  while (tree_00 != (HTS_Tree *)0x0) {
    p_Var1 = tree_00->next;
    HTS_Tree_clear(tree_00);
    HTS_free((void *)0x2124f4);
    tree_00 = p_Var1;
  }
  if (in_RDI->pdf != (float ***)0x0) {
    for (local_10 = 2; local_10 <= in_RDI->ntree + 1; local_10 = local_10 + 1) {
      for (local_18 = 1; local_18 <= in_RDI->npdf[local_10]; local_18 = local_18 + 1) {
        HTS_free((void *)0x212575);
      }
      in_RDI->pdf[local_10] = in_RDI->pdf[local_10] + 1;
      HTS_free((void *)0x2125b6);
    }
    in_RDI->pdf = in_RDI->pdf + 2;
    HTS_free((void *)0x2125e8);
  }
  if (in_RDI->npdf != (size_t *)0x0) {
    in_RDI->npdf = in_RDI->npdf + 2;
    HTS_free((void *)0x212613);
  }
  HTS_Model_initialize(in_RDI);
  return;
}

Assistant:

static void HTS_Model_clear(HTS_Model * model)
{
   size_t i, j;
   HTS_Question *question, *next_question;
   HTS_Tree *tree, *next_tree;

   for (question = model->question; question; question = next_question) {
      next_question = question->next;
      HTS_Question_clear(question);
      HTS_free(question);
   }
   for (tree = model->tree; tree; tree = next_tree) {
      next_tree = tree->next;
      HTS_Tree_clear(tree);
      HTS_free(tree);
   }
   if (model->pdf) {
      for (i = 2; i <= model->ntree + 1; i++) {
         for (j = 1; j <= model->npdf[i]; j++) {
            HTS_free(model->pdf[i][j]);
         }
         model->pdf[i]++;
         HTS_free(model->pdf[i]);
      }
      model->pdf += 2;
      HTS_free(model->pdf);
   }
   if (model->npdf) {
      model->npdf += 2;
      HTS_free(model->npdf);
   }
   HTS_Model_initialize(model);
}